

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

Vec_Ptr_t * Fra_SmlSortUsingOnes(Fra_Sml_t *p,int fLatchCorr)

{
  int *piVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  void *__ptr;
  void *__s;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  size_t __size;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  
  uVar14 = p->nWordsTotal;
  if ((int)uVar14 < 1) {
    __assert_fail("p->nWordsTotal > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x9f,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
  }
  pVVar6 = p->pAig->vObjs;
  iVar13 = pVVar6->nSize;
  lVar17 = (long)iVar13;
  __ptr = calloc(1,lVar17 * 4);
  if (0 < lVar17) {
    ppvVar7 = pVVar6->pArray;
    iVar8 = 0;
    lVar15 = 0;
    do {
      if (ppvVar7[lVar15] != (void *)0x0) {
        uVar16 = (ulong)p->nWordsPref;
        iVar21 = 0;
        if (p->nWordsPref < (int)uVar14) {
          iVar21 = 0;
          do {
            uVar20 = *(uint *)((long)&p[1].pAig + uVar16 * 4 + (long)iVar8 * 4);
            uVar20 = (uVar20 >> 1 & 0x55555555) + (uVar20 & 0x55555555);
            uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333);
            uVar20 = (uVar20 >> 4 & 0x7070707) + (uVar20 & 0x7070707);
            uVar20 = (uVar20 >> 8 & 0xf000f) + (uVar20 & 0xf000f);
            iVar21 = (uVar20 >> 0x10) + iVar21 + (uVar20 & 0xffff);
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
        }
        *(int *)((long)__ptr + lVar15 * 4) = iVar21;
      }
      lVar15 = lVar15 + 1;
      iVar8 = iVar8 + uVar14;
    } while (lVar15 != lVar17);
  }
  uVar12 = uVar14 * 0x20;
  uVar20 = uVar12 + 1;
  uVar16 = (ulong)uVar20;
  __s = calloc(1,uVar16 * 4);
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  else {
    ppvVar7 = pVVar6->pArray;
    lVar15 = 0;
    iVar13 = 0;
    do {
      if ((lVar15 != 0) && (ppvVar7[lVar15] != (void *)0x0)) {
        uVar9 = (uint)*(undefined8 *)((long)ppvVar7[lVar15] + 0x18) & 7;
        if (fLatchCorr == 0) {
          if ((uVar9 == 2) || (uVar9 - 5 < 2)) goto LAB_0069cd8b;
        }
        else if (uVar9 == 2) {
LAB_0069cd8b:
          uVar9 = *(uint *)((long)__ptr + lVar15 * 4);
          if (uVar9 != uVar12 && SBORROW4(uVar9,uVar12) == (int)(uVar9 + uVar14 * -0x20) < 0) {
            __assert_fail("pnBits[i] <= nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                          ,0xb8,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
          }
          piVar1 = (int *)((long)__s + (long)(int)uVar9 * 4);
          *piVar1 = *piVar1 + 1;
          iVar13 = iVar13 + 1;
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar17 != lVar15);
  }
  pvVar5 = malloc((long)(int)(iVar13 + uVar20) << 2);
  __size = 0x10;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar20;
  ppvVar7 = (void **)malloc(uVar16 * 8);
  pVVar6->pArray = ppvVar7;
  *ppvVar7 = pvVar5;
  uVar10 = uVar16;
  uVar4 = 2;
  uVar18 = 1;
  do {
    uVar11 = uVar4;
    iVar8 = *(int *)((long)__s + uVar18 * 4 + -4);
    iVar21 = (int)uVar11;
    if ((int)uVar18 == (int)uVar10) {
      ppvVar7 = pVVar6->pArray;
      if (uVar18 < 0x10) {
        if (ppvVar7 == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(ppvVar7,0x80);
        }
        pVVar6->pArray = ppvVar7;
        uVar11 = 0x10;
      }
      else {
        if (ppvVar7 == (void **)0x0) {
          ppvVar7 = (void **)malloc(__size);
        }
        else {
          ppvVar7 = (void **)realloc(ppvVar7,__size);
        }
        pVVar6->pArray = ppvVar7;
      }
    }
    else {
      ppvVar7 = pVVar6->pArray;
      uVar11 = uVar10;
    }
    pvVar5 = (void *)((long)pvVar5 + (long)iVar8 * 4 + 4);
    ppvVar7[uVar18] = pvVar5;
    uVar19 = uVar18 + 1;
    __size = __size + 0x10;
    bVar22 = uVar18 != uVar12;
    uVar10 = uVar11;
    uVar4 = (ulong)(iVar21 + 2);
    uVar18 = uVar19;
  } while (bVar22);
  pVVar6->nSize = (int)uVar19;
  pVVar6->nCap = (int)uVar11;
  pAVar2 = p->pAig;
  iVar21 = 0;
  memset(__s,0,uVar16 * 4);
  pVVar3 = pAVar2->vObjs;
  iVar8 = pVVar3->nSize;
  if (0 < iVar8) {
    ppvVar7 = pVVar3->pArray;
    lVar17 = 0;
    do {
      if ((lVar17 != 0) && (ppvVar7[lVar17] != (void *)0x0)) {
        uVar14 = (uint)*(undefined8 *)((long)ppvVar7[lVar17] + 0x18) & 7;
        if (fLatchCorr == 0) {
          if ((uVar14 == 2) || (uVar14 - 5 < 2)) goto LAB_0069cf15;
        }
        else if (uVar14 == 2) {
LAB_0069cf15:
          iVar8 = *(int *)((long)__ptr + lVar17 * 4);
          lVar15 = (long)iVar8;
          if ((lVar15 < 0) || ((int)uVar19 <= iVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar5 = pVVar6->pArray[lVar15];
          iVar8 = *(int *)((long)__s + lVar15 * 4);
          *(int *)((long)__s + lVar15 * 4) = iVar8 + 1;
          *(int *)((long)pvVar5 + (long)iVar8 * 4) = (int)lVar17;
          iVar8 = pVVar3->nSize;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar8);
  }
  ppvVar7 = pVVar6->pArray;
  uVar16 = 0;
  do {
    pvVar5 = ppvVar7[uVar16];
    iVar8 = *(int *)((long)__s + uVar16 * 4);
    *(int *)((long)__s + uVar16 * 4) = iVar8 + 1;
    *(undefined4 *)((long)pvVar5 + (long)iVar8 * 4) = 0;
    iVar21 = iVar21 + iVar8 + 1;
    uVar16 = uVar16 + 1;
  } while ((uVar19 & 0xffffffff) != uVar16);
  if (iVar21 != iVar13 + uVar20) {
    __assert_fail("nTotal == nNodes + nBits + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0xe3,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
  }
  free(__s);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Fra_SmlSortUsingOnes( Fra_Sml_t * p, int fLatchCorr )
{
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i, nNodes, nTotal, nBits, * pnNodes, * pnBits, * pMemory;
    assert( p->nWordsTotal > 0 );
    // count 1s in each node's siminfo
    pnBits = Fra_SmlCountOnes( p );
    // count number of nodes having that many 1s
    nNodes = 0;
    nBits = p->nWordsTotal * 32;
    pnNodes = ABC_ALLOC( int, nBits + 1 );
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        assert( pnBits[i] <= nBits ); // "<" because of normalized info
        pnNodes[pnBits[i]]++;
        nNodes++;
    }
    // allocate memory for all the nodes
    pMemory = ABC_ALLOC( int, nNodes + nBits + 1 );  
    // markup the memory for each node
    vNodes = Vec_PtrAlloc( nBits + 1 );
    Vec_PtrPush( vNodes, pMemory );
    for ( i = 1; i <= nBits; i++ )
    {
        pMemory += pnNodes[i-1] + 1;
        Vec_PtrPush( vNodes, pMemory );
    }
    // add the nodes
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        pMemory = (int *)Vec_PtrEntry( vNodes, pnBits[i] );
        pMemory[ pnNodes[pnBits[i]]++ ] = i;
    }
    // add 0s in the end
    nTotal = 0;
    Vec_PtrForEachEntry( int *, vNodes, pMemory, i )
    {
        pMemory[ pnNodes[i]++ ] = 0;
        nTotal += pnNodes[i];
    }
    assert( nTotal == nNodes + nBits + 1 );
    ABC_FREE( pnNodes );
    ABC_FREE( pnBits );
    return vNodes;
}